

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cubbyhole.cpp
# Opt level: O0

ssize_t __thiscall Vault::Cubbyhole::read(Cubbyhole *this,int __fd,void *__buf,size_t __nbytes)

{
  Client *client;
  undefined4 in_register_00000034;
  Url local_40;
  void *local_20;
  Path *path_local;
  Cubbyhole *this_local;
  
  path_local = (Path *)CONCAT44(in_register_00000034,__fd);
  client = *(Client **)path_local;
  local_20 = __buf;
  this_local = this;
  getUrl(&local_40,(Cubbyhole *)path_local,(Path *)__buf);
  HttpConsumer::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this,client,&local_40);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_40);
  return (ssize_t)this;
}

Assistant:

std::optional<std::string> Vault::Cubbyhole::read(const Path &path) {
  return Vault::HttpConsumer::get(client_, getUrl(path));
}